

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

int __thiscall
QDomNamedNodeMapPrivate::clone
          (QDomNamedNodeMapPrivate *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  int iVar2;
  const_iterator *this_00;
  pointer pQVar3;
  QDomNodePrivate **ppQVar4;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  QDomNodePrivate *new_node;
  const_iterator it;
  unique_ptr<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_> m;
  QDomNodePrivate *in_stack_ffffffffffffff78;
  QDomNamedNodeMapPrivate *in_stack_ffffffffffffff80;
  unique_ptr<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_> *this_01;
  const_iterator local_40;
  const_iterator local_28;
  unique_ptr<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_> local_10;
  QDomNodePrivate *arg;
  
  arg = *(QDomNodePrivate **)(in_FS_OFFSET + 0x28);
  local_10._M_t.
  super___uniq_ptr_impl<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>.
  super__Head_base<0UL,_QDomNamedNodeMapPrivate_*,_false>._M_head_impl =
       (__uniq_ptr_data<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>,_true,_true>
        )&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (const_iterator *)operator_new(0x28);
  QDomNamedNodeMapPrivate(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::unique_ptr<QDomNamedNodeMapPrivate,std::default_delete<QDomNamedNodeMapPrivate>>::
  unique_ptr<std::default_delete<QDomNamedNodeMapPrivate>,void>
            ((unique_ptr<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_> *)
             in_stack_ffffffffffffff80,(pointer)in_stack_ffffffffffffff78);
  bVar1 = this->readonly;
  pQVar3 = std::unique_ptr<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_>::
           operator->((unique_ptr<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_>
                       *)0x11232d);
  pQVar3->readonly = (bool)(bVar1 & 1);
  bVar1 = this->appendToParent;
  pQVar3 = std::unique_ptr<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_>::
           operator->((unique_ptr<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_>
                       *)0x112350);
  pQVar3->appendToParent = (bool)(bVar1 & 1);
  local_28.i.d = (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)&DAT_aaaaaaaaaaaaaaaa
  ;
  local_28.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_28.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
  QMultiHash<QString,_QDomNodePrivate_*>::constBegin((QMultiHash<QString,_QDomNodePrivate_*> *)this)
  ;
  while( true ) {
    QMultiHash<QString,_QDomNodePrivate_*>::constEnd
              ((QMultiHash<QString,_QDomNodePrivate_*> *)in_stack_ffffffffffffff80);
    bVar1 = QMultiHash<QString,_QDomNodePrivate_*>::const_iterator::operator!=(&local_28,&local_40);
    if (!bVar1) break;
    ppQVar4 = QMultiHash<QString,_QDomNodePrivate_*>::const_iterator::value(&local_28);
    iVar2 = (*(*ppQVar4)->_vptr_QDomNodePrivate[8])(*ppQVar4,1);
    QDomNodePrivate::setParent
              ((QDomNodePrivate *)CONCAT44(extraout_var,iVar2),(QDomNodePrivate *)__fn);
    std::unique_ptr<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_>::
    operator->((unique_ptr<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_> *
               )0x1123ef);
    setNamedItem(this,arg);
    QMultiHash<QString,_QDomNodePrivate_*>::const_iterator::operator++(this_00);
  }
  this_01 = &local_10;
  std::unique_ptr<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_>::
  operator->((unique_ptr<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_> *)
             0x112417);
  QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x11241f);
  pQVar3 = std::unique_ptr<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_>::
           release((unique_ptr<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_>
                    *)0x112429);
  std::unique_ptr<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_>::
  ~unique_ptr(this_01);
  if (*(QDomNodePrivate **)(in_FS_OFFSET + 0x28) == arg) {
    return (int)pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QDomNamedNodeMapPrivate* QDomNamedNodeMapPrivate::clone(QDomNodePrivate *pimpl)
{
    std::unique_ptr<QDomNamedNodeMapPrivate> m(new QDomNamedNodeMapPrivate(pimpl));
    m->readonly = readonly;
    m->appendToParent = appendToParent;

    auto it = map.constBegin();
    for (; it != map.constEnd(); ++it) {
        QDomNodePrivate *new_node = it.value()->cloneNode();
        new_node->setParent(pimpl);
        m->setNamedItem(new_node);
    }

    // we are no longer interested in ownership
    m->ref.deref();
    return m.release();
}